

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void build_backtrace(JSContext *ctx,JSValue error_obj,char *filename,int line_num,
                    int backtrace_flags)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  JSStackFrame *pJVar4;
  void *pvVar5;
  long lVar6;
  JSValueUnion JVar7;
  JSValue setter;
  byte bVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  JSValueUnion *pJVar16;
  uint uVar17;
  char *pcVar18;
  uint8_t *buf_end;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint uVar21;
  bool bVar22;
  JSValue JVar23;
  JSValue val1;
  JSValue val;
  DynBuf dbuf;
  int32_t local_88;
  uint uStack_84;
  undefined8 uStack_80;
  uint8_t *local_78;
  DynBuf local_70;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  
  dbuf_init2(&local_70,ctx->rt,js_realloc_rt);
  if (filename != (char *)0x0) {
    dbuf_printf(&local_70,"    at %s",filename);
    if (line_num != -1) {
      dbuf_printf(&local_70,":%d",CONCAT44(0,line_num));
    }
    dbuf_putc(&local_70,'\n');
    sVar11 = strlen(filename);
    JVar23 = JS_NewStringLen(ctx,filename,sVar11);
    JS_DefinePropertyValue(ctx,error_obj,0x31,JVar23,3);
    local_88 = 0;
    uStack_80 = 3;
    local_40 = 0;
    uStack_38 = 3;
    JVar23.tag = 3;
    JVar23.u.ptr = (void *)((ulong)uStack_84 << 0x20);
    setter.tag = 3;
    setter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
    val.tag = 0;
    val.u = (JSValueUnion)CONCAT44(0,line_num);
    JS_DefineProperty(ctx,error_obj,0x32,val,JVar23,setter,0x2703);
    if ((backtrace_flags & 2U) != 0) goto LAB_00128d94;
  }
  for (pJVar4 = ctx->rt->current_stack_frame; pJVar4 != (JSStackFrame *)0x0;
      pJVar4 = pJVar4->prev_frame) {
    uVar14 = 0;
    if ((backtrace_flags & 1U) == 0) {
      if ((int)(pJVar4->cur_func).tag == -1) {
        pvVar5 = (pJVar4->cur_func).u.ptr;
        lVar6 = *(long *)((long)pvVar5 + 0x18);
        uVar14 = *(uint *)(lVar6 + (long)(int)(~*(uint *)(lVar6 + 0x20) | 0xffffffc9) * 4);
        if (uVar14 == 0) goto LAB_00128b47;
        do {
          uVar13 = (ulong)uVar14;
          if (*(int *)(lVar6 + 0x3c + uVar13 * 8) == 0x36) {
            if (0x3fffffff < *(uint *)(lVar6 + 0x38 + uVar13 * 8)) goto LAB_00128b47;
            pJVar16 = (JSValueUnion *)((uVar13 - 1) * 0x10 + *(long *)((long)pvVar5 + 0x20));
            JVar7 = pJVar16[1];
            if (JVar7.int32 != -7) goto LAB_00128b47;
            val1.tag = (int64_t)JVar7.ptr;
            val1.u.ptr = pJVar16->ptr;
            pcVar12 = JS_ToCStringLen2(ctx,(size_t *)0x0,val1,0);
            pcVar18 = (char *)0x0;
            if ((pcVar12 != (char *)0x0) && (pcVar18 = pcVar12, *pcVar12 != '\0')) {
              dbuf_printf(&local_70,"    at %s",pcVar12);
              goto LAB_00128b67;
            }
            break;
          }
          pcVar18 = (char *)0x0;
          uVar14 = *(uint *)(lVar6 + 0x38 + uVar13 * 8) & 0x3ffffff;
        } while (uVar14 != 0);
      }
      else {
LAB_00128b47:
        pcVar18 = (char *)0x0;
      }
      dbuf_printf(&local_70,"    at %s","<anonymous>");
      pcVar12 = pcVar18;
LAB_00128b67:
      JS_FreeCString(ctx,pcVar12);
      pvVar5 = (pJVar4->cur_func).u.ptr;
      uVar13 = (ulong)*(ushort *)((long)pvVar5 + 6);
      uVar14 = backtrace_flags;
      if ((uVar13 < 0x32) && ((0x2200000012000U >> (uVar13 & 0x3f) & 1) != 0)) {
        lVar6 = *(long *)((long)pvVar5 + 0x30);
        uVar1 = *(ushort *)(lVar6 + 0x19);
        if ((uVar1 >> 10 & 1) != 0) {
          puVar19 = *(uint8_t **)(lVar6 + 0x70);
          if (puVar19 == (uint8_t *)0x0) {
            iVar10 = -1;
          }
          else {
            uVar2 = *(uint *)(lVar6 + 0x20);
            iVar3 = *(int *)&pJVar4->cur_pc;
            buf_end = puVar19 + *(int *)(lVar6 + 0x6c);
            uVar17 = 0;
            iVar9 = *(int *)(lVar6 + 100);
            do {
              iVar10 = iVar9;
              if (buf_end <= puVar19) break;
              puVar20 = puVar19 + 1;
              if (*puVar19 == '\0') {
                if (puVar20 < buf_end) {
                  bVar8 = 0;
                  iVar9 = 1;
                  uVar15 = 0;
                  uVar21 = 0;
                  puVar20 = puVar19 + 2;
                  while (uVar21 = (puVar20[-1] & 0x7f) << (bVar8 & 0x1f) | uVar21,
                        (char)puVar20[-1] < '\0') {
                    if (3 < uVar15) goto LAB_00128cb0;
                    uVar15 = uVar15 + 1;
                    bVar8 = bVar8 + 7;
                    iVar9 = iVar9 + 1;
                    bVar22 = buf_end <= puVar20;
                    puVar20 = puVar20 + 1;
                    if (bVar22) goto LAB_00128cb0;
                  }
                  if ((-1 < iVar9) &&
                     (local_78 = buf_end, uVar15 = get_sleb128(&local_88,puVar20,buf_end),
                     -1 < (int)uVar15)) {
                    puVar20 = puVar20 + uVar15;
                    iVar9 = local_88 + iVar10;
                    buf_end = local_78;
                    goto LAB_00128c0d;
                  }
                }
LAB_00128cb0:
                iVar10 = *(int *)(lVar6 + 100);
                break;
              }
              bVar8 = *puVar19 - 1;
              uVar21 = bVar8 / 5;
              iVar9 = (uint)(byte)(bVar8 + (char)uVar21 * -5) + iVar10 + -1;
LAB_00128c0d:
              uVar17 = uVar17 + uVar21;
              puVar19 = puVar20;
            } while (uVar17 <= ~uVar2 + iVar3);
          }
          pcVar12 = JS_AtomToCString(ctx,*(JSAtom *)(lVar6 + 0x60));
          pcVar18 = pcVar12;
          if (pcVar12 == (char *)0x0) {
            pcVar18 = "<null>";
          }
          dbuf_printf(&local_70," (%s",pcVar18);
          JS_FreeCString(ctx,pcVar12);
          if (iVar10 != -1) {
            dbuf_printf(&local_70,":%d");
          }
          dbuf_putc(&local_70,')');
        }
        dbuf_putc(&local_70,'\n');
        if ((uVar1 >> 0xb & 1) != 0) break;
      }
      else {
        dbuf_printf(&local_70," (native)");
        dbuf_putc(&local_70,'\n');
      }
    }
    backtrace_flags = uVar14;
  }
LAB_00128d94:
  dbuf_putc(&local_70,'\0');
  if (local_70.error == 0) {
    sVar11 = strlen((char *)local_70.buf);
    JVar23 = JS_NewStringLen(ctx,(char *)local_70.buf,sVar11);
  }
  else {
    JVar23 = (JSValue)(ZEXT816(2) << 0x40);
  }
  dbuf_free(&local_70);
  JS_DefinePropertyValue(ctx,error_obj,0x35,JVar23,3);
  return;
}

Assistant:

static void build_backtrace(JSContext *ctx, JSValueConst error_obj,
                            const char *filename, int line_num,
                            int backtrace_flags)
{
    JSStackFrame *sf;
    JSValue str;
    DynBuf dbuf;
    const char *func_name_str;
    const char *str1;
    JSObject *p;
    BOOL backtrace_barrier;
    
    js_dbuf_init(ctx, &dbuf);
    if (filename) {
        dbuf_printf(&dbuf, "    at %s", filename);
        if (line_num != -1)
            dbuf_printf(&dbuf, ":%d", line_num);
        dbuf_putc(&dbuf, '\n');
        str = JS_NewString(ctx, filename);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_fileName, str,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_lineNumber, JS_NewInt32(ctx, line_num),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        if (backtrace_flags & JS_BACKTRACE_FLAG_SINGLE_LEVEL)
            goto done;
    }
    for(sf = ctx->rt->current_stack_frame; sf != NULL; sf = sf->prev_frame) {
        if (backtrace_flags & JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL) {
            backtrace_flags &= ~JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL;
            continue;
        }
        func_name_str = get_func_name(ctx, sf->cur_func);
        if (!func_name_str || func_name_str[0] == '\0')
            str1 = "<anonymous>";
        else
            str1 = func_name_str;
        dbuf_printf(&dbuf, "    at %s", str1);
        JS_FreeCString(ctx, func_name_str);

        p = JS_VALUE_GET_OBJ(sf->cur_func);
        backtrace_barrier = FALSE;
        if (js_class_has_bytecode(p->class_id)) {
            JSFunctionBytecode *b;
            const char *atom_str;
            int line_num1;

            b = p->u.func.function_bytecode;
            backtrace_barrier = b->backtrace_barrier;
            if (b->has_debug) {
                line_num1 = find_line_num(ctx, b,
                                          sf->cur_pc - b->byte_code_buf - 1);
                atom_str = JS_AtomToCString(ctx, b->debug.filename);
                dbuf_printf(&dbuf, " (%s",
                            atom_str ? atom_str : "<null>");
                JS_FreeCString(ctx, atom_str);
                if (line_num1 != -1)
                    dbuf_printf(&dbuf, ":%d", line_num1);
                dbuf_putc(&dbuf, ')');
            }
        } else {
            dbuf_printf(&dbuf, " (native)");
        }
        dbuf_putc(&dbuf, '\n');
        /* stop backtrace if JS_EVAL_FLAG_BACKTRACE_BARRIER was used */
        if (backtrace_barrier)
            break;
    }
 done:
    dbuf_putc(&dbuf, '\0');
    if (dbuf_error(&dbuf))
        str = JS_NULL;
    else
        str = JS_NewString(ctx, (char *)dbuf.buf);
    dbuf_free(&dbuf);
    JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_stack, str,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
}